

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O0

void __thiscall leveldb::AutoCompactTest::~AutoCompactTest(AutoCompactTest *this)

{
  Options local_78;
  Status local_18;
  AutoCompactTest *local_10;
  AutoCompactTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AutoCompactTest_001e7070;
  local_10 = this;
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  Options::Options(&local_78);
  DestroyDB((leveldb *)&local_18,&this->dbname_,&local_78);
  Status::~Status(&local_18);
  if (this->tiny_cache_ != (Cache *)0x0) {
    (*this->tiny_cache_->_vptr_Cache[1])();
  }
  std::__cxx11::string::~string((string *)&this->dbname_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~AutoCompactTest() {
    delete db_;
    DestroyDB(dbname_, Options());
    delete tiny_cache_;
  }